

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  undefined8 *puVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  uint uVar10;
  ImU32 IVar11;
  float fVar12;
  bool hovered;
  bool held;
  ImVec2 center;
  ImRect bb;
  bool local_b2;
  bool local_b1;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  ImRect local_98;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec4 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  local_98.Min.x = pos->x - radius;
  local_98.Min.y = pos->y - radius;
  local_98.Max.x = pos->x + radius;
  local_a8._0_4_ = radius;
  local_98.Max.y = pos->y + radius;
  bVar9 = ButtonBehavior(&local_98,id,&local_b2,&local_b1,0);
  if ((local_b1 != true) || (uVar10 = 0x24, local_b2 == false)) {
    uVar10 = local_b2 | 0x22;
  }
  puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar10 << 4));
  local_78._0_8_ = *puVar1;
  uVar4 = puVar1[1];
  local_78.w = (float)((ulong)uVar4 >> 0x20);
  local_78.z = (float)uVar4;
  local_78.w = (GImGui->Style).Alpha * local_78.w;
  IVar11 = ColorConvertFloat4ToU32(&local_78);
  local_b0.x = (local_98.Min.x + local_98.Max.x) * 0.5;
  local_b0.y = (local_98.Min.y + local_98.Max.y) * 0.5;
  fVar12 = 2.0;
  if (2.0 <= (float)local_a8._0_4_) {
    fVar12 = (float)local_a8._0_4_;
  }
  ImDrawList::AddCircleFilled(pIVar2->DrawList,&local_b0,fVar12,IVar11,0xc);
  if (local_b2 == true) {
    fVar12 = (float)local_a8._0_4_ * 0.7071 + -1.0;
    pIVar3 = pIVar2->DrawList;
    local_48 = ZEXT416((uint)(fVar12 + local_b0.x));
    local_a8 = ZEXT416((uint)(fVar12 + local_b0.y));
    local_80.y = fVar12 + local_b0.y;
    local_80.x = fVar12 + local_b0.x;
    local_58 = ZEXT416((uint)(local_b0.x - fVar12));
    local_68 = ZEXT416((uint)(local_b0.y - fVar12));
    local_88.y = local_b0.y - fVar12;
    local_88.x = local_b0.x - fVar12;
    local_78.x = (GImGui->Style).Colors[0].x;
    local_78.y = (GImGui->Style).Colors[0].y;
    uVar5 = (GImGui->Style).Colors[0].z;
    uVar6 = (GImGui->Style).Colors[0].w;
    local_78.w = (GImGui->Style).Alpha * (float)uVar6;
    local_78.z = (float)uVar5;
    IVar11 = ColorConvertFloat4ToU32(&local_78);
    ImDrawList::AddLine(pIVar3,&local_80,&local_88,IVar11,1.0);
    pIVar3 = pIVar2->DrawList;
    local_80.y = (float)local_68._0_4_;
    local_80.x = (float)local_48._0_4_;
    local_88.y = (float)local_a8._0_4_;
    local_88.x = (float)local_58._0_4_;
    local_78.x = (GImGui->Style).Colors[0].x;
    local_78.y = (GImGui->Style).Colors[0].y;
    uVar7 = (GImGui->Style).Colors[0].z;
    uVar8 = (GImGui->Style).Colors[0].w;
    local_78.w = (GImGui->Style).Alpha * (float)uVar8;
    local_78.z = (float)uVar7;
    IVar11 = ColorConvertFloat4ToU32(&local_78);
    ImDrawList::AddLine(pIVar3,&local_80,&local_88,IVar11,1.0);
  }
  return bVar9;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiWindow* window = GetCurrentWindow();

    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_CloseButtonActive : hovered ? ImGuiCol_CloseButtonHovered : ImGuiCol_CloseButton);
    const ImVec2 center = bb.GetCenter();
    window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), col, 12);

    const float cross_extent = (radius * 0.7071f) - 1.0f;
    if (hovered)
    {
        window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), GetColorU32(ImGuiCol_Text));
        window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), GetColorU32(ImGuiCol_Text));
    }

    return pressed;
}